

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates_example.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Addition result (integers): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xf);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Addition result (float): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xf);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Let's use the AddNumbers function with integers.
  // We define two integer variables that are set to const, this means that the
  // compiler knows that once defined they cannot change. In other words, the
  // 'const' prefix tells the compiler that their values cannot changed. If the
  // compiler will complain if the user tries to change the value of the
  // variables after being defined, 
  const int integer_number_1 = 5;
  const int integer_number_2 = 10;
  const int integer_result = AddNumbers<int>(integer_number_1,
                                             integer_number_2);

  std::cout << "Addition result (integers): " << integer_result << std::endl;
  
  // ** Example about attempting to change the value of the variables.
  // Uncomment the following line to generate the compiler error.
  // integer_number_1 = 15;
  // ** End of example about attempting to change the value of the variables.

  // Let's add up two floating point values.
  const float floating_number_1 = 6.0f;
  const float floating_number_2 = 1.0f;
  const float floating_result = AddNumbers<float>(floating_number_1,
                                                  floating_number_2);

  std::cout << "Addition result (float): " << integer_result << std::endl;

  // Can we use templates in classes? Of course! In fact, when we use
  // std::vector<SomeType> or std::map<KeyType, ValueType> we are using
  // templates. Can you imagine if C++ would not have templates? We would
  // have to create a vector for ints, floats, strings, and any other
  // data type that we can imagine.

  // What happens with the code below? Do you think it will compile? Note
  // that we are omiting the template type.
  const float result2 = AddNumbers(floating_number_1, floating_number_2);
  // In this case the compiler sees that the two arguments are two floats,
  // thus SomeType = float and thus is able to deduce the right type of the
  // result.
  return 0;
}